

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

type fmt::v5::
     visit_format_arg<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>,fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::string>,char>>
               (arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
                *vis,basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
                     *arg)

{
  handle handle;
  basic_string_view<char> value;
  arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *this;
  custom_value<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *in_RSI;
  arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *in_RDI;
  arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff92;
  uint in_stack_ffffffffffffff94;
  arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *in_stack_ffffffffffffff98;
  char_type *in_stack_ffffffffffffffa0;
  double in_stack_ffffffffffffffb0;
  arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffca;
  arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8;
  
  this = (arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
          *)(ulong)*(uint *)&in_RSI[1].value;
  switch(this) {
  case (arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
        *)0x0:
  default:
switchD_00124aa8_default:
    local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              internal::
              arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
              ::operator()(in_RDI);
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
        *)0x1:
    goto switchD_00124aa8_default;
  case (arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
        *)0x2:
    local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              internal::
              arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>
              ::operator()(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
        *)0x3:
    local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              internal::
              arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>
              ::operator()(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
        *)0x4:
    local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              internal::
              arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>
              ::operator()(in_stack_ffffffffffffff98,
                           CONCAT44(in_stack_ffffffffffffff94,
                                    CONCAT22(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90)));
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
        *)0x5:
    local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              internal::
              arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>
              ::operator()(in_stack_ffffffffffffff98,
                           CONCAT44(in_stack_ffffffffffffff94,
                                    CONCAT22(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90)));
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
        *)0x6:
    local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              internal::
              arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>
              ::operator()(in_stack_ffffffffffffff98,SUB41(in_stack_ffffffffffffff94 >> 0x18,0));
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
        *)0x7:
    local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              internal::
              arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>
              ::operator()(this,(char)((ulong)in_stack_ffffffffffffffa0 >> 0x38));
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
        *)0x8:
    local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              internal::
              arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>
              ::operator()(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
        *)0x9:
    local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              internal::
              arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>
              ::operator()(in_stack_ffffffffffffffd8,
                           (longdouble)CONCAT28(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0)
                          );
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
        *)0xa:
    local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              internal::
              arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
              ::operator()(this,in_stack_ffffffffffffffa0);
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
        *)0xb:
    basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)&stack0xffffffffffffffd8,(char *)in_RSI->value,
               (size_t)in_RSI->format);
    value.size_._0_2_ = in_stack_ffffffffffffffc8;
    value.data_ = (char *)in_stack_ffffffffffffffc0;
    value.size_._2_6_ = in_stack_ffffffffffffffca;
    local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              internal::
              arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
              ::operator()(in_stack_ffffffffffffffb8,value);
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
        *)0xc:
    local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              internal::
              arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
              ::operator()(this,in_stack_ffffffffffffffa0);
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
        *)0xd:
    basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
    ::handle::handle((handle *)&stack0xffffffffffffffc8,*in_RSI);
    handle.custom_.value._2_2_ = in_stack_ffffffffffffff92;
    handle.custom_.value._0_2_ = in_stack_ffffffffffffff90;
    handle.custom_.value._4_4_ = in_stack_ffffffffffffff94;
    handle.custom_.format =
         (_func_void_void_ptr_basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_ptr
          *)in_RDI;
    local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
              ::operator()(in_stack_ffffffffffffff88,handle);
  }
  return (type)local_8;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}